

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O3

void DC16_SSE2(uint8_t *dst)

{
  uint8_t *puVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  undefined4 uVar7;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 auVar8 [16];
  
  auVar8 = psadbw((undefined1  [16])0x0,*(undefined1 (*) [16])(dst + -0x20));
  iVar3 = 0;
  lVar6 = -1;
  do {
    iVar3 = iVar3 + (uint)dst[lVar6];
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0x1ff);
  uVar4 = iVar3 + CONCAT22(auVar8._10_2_ + auVar8._2_2_,auVar8._8_2_ + auVar8._0_2_) + 0x10;
  uVar5 = uVar4 >> 5;
  bVar2 = (byte)(uVar4 >> 0x18);
  uVar10 = (undefined1)(uVar5 >> 0x10);
  uVar9 = (undefined1)(uVar5 >> 8);
  auVar8._4_4_ = (int)(CONCAT35(CONCAT21(CONCAT11(bVar2 >> 5,bVar2 >> 5),uVar10),
                                CONCAT14(uVar10,uVar5)) >> 0x20);
  auVar8[3] = uVar9;
  auVar8[2] = uVar9;
  auVar8[0] = (undefined1)uVar5;
  auVar8[1] = auVar8[0];
  auVar8._8_8_ = 0;
  auVar8 = pshuflw(auVar8,auVar8,0);
  uVar7 = auVar8._0_4_;
  lVar6 = 0;
  do {
    puVar1 = dst + lVar6;
    *(undefined4 *)puVar1 = uVar7;
    *(undefined4 *)(puVar1 + 4) = uVar7;
    *(undefined4 *)(puVar1 + 8) = uVar7;
    *(undefined4 *)(puVar1 + 0xc) = uVar7;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0x200);
  return;
}

Assistant:

static void DC16_SSE2(uint8_t* dst) {  // DC
  const __m128i zero = _mm_setzero_si128();
  const __m128i top = _mm_loadu_si128((const __m128i*)(dst - BPS));
  const __m128i sad8x2 = _mm_sad_epu8(top, zero);
  // sum the two sads: sad8x2[0:1] + sad8x2[8:9]
  const __m128i sum = _mm_add_epi16(sad8x2, _mm_shuffle_epi32(sad8x2, 2));
  int left = 0;
  int j;
  for (j = 0; j < 16; ++j) {
    left += dst[-1 + j * BPS];
  }
  {
    const int DC = _mm_cvtsi128_si32(sum) + left + 16;
    Put16_SSE2(DC >> 5, dst);
  }
}